

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void PopHead<stTimeoutItem_t,stTimeoutItemLink_t>(stTimeoutItemLink_t *apLink)

{
  stTimeoutItem_t *psVar1;
  stTimeoutItem_t *lp;
  stTimeoutItemLink_t *apLink_local;
  
  if (apLink->head != (stTimeoutItem_t *)0x0) {
    psVar1 = apLink->head;
    if (apLink->head == apLink->tail) {
      apLink->tail = (stTimeoutItem_t *)0x0;
      apLink->head = (stTimeoutItem_t *)0x0;
    }
    else {
      apLink->head = apLink->head->pNext;
    }
    psVar1->pNext = (stTimeoutItem_t *)0x0;
    psVar1->pPrev = (stTimeoutItem_t *)0x0;
    psVar1->pLink = (stTimeoutItemLink_t *)0x0;
    if (apLink->head != (stTimeoutItem_t *)0x0) {
      apLink->head->pPrev = (stTimeoutItem_t *)0x0;
    }
  }
  return;
}

Assistant:

void inline PopHead( TLink*apLink )
{
	if( !apLink->head ) 
	{
		return ;
	}
	TNode *lp = apLink->head;
	if( apLink->head == apLink->tail )
	{
		apLink->head = apLink->tail = NULL;
	}
	else
	{
		apLink->head = apLink->head->pNext;
	}

	lp->pPrev = lp->pNext = NULL;
	lp->pLink = NULL;

	if( apLink->head )
	{
		apLink->head->pPrev = NULL;
	}
}